

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.cpp
# Opt level: O2

void __thiscall Json_BadKeyword_Test::TestBody(Json_BadKeyword_Test *this)

{
  allocator local_29;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"nu",&local_29);
  anon_unknown.dwarf_b7c4f::Json::check_error(&local_28,expected_token);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"bad",&local_29);
  anon_unknown.dwarf_b7c4f::Json::check_error(&local_28,expected_token);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"fal",&local_29);
  anon_unknown.dwarf_b7c4f::Json::check_error(&local_28,expected_token);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string((string *)&local_28,"falsehood",&local_29);
  anon_unknown.dwarf_b7c4f::Json::check_error(&local_28,unexpected_extra_input);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST_F (Json, BadKeyword) {
    check_error ("nu", json::error_code::expected_token);
    check_error ("bad", json::error_code::expected_token);
    check_error ("fal", json::error_code::expected_token);
    check_error ("falsehood", json::error_code::unexpected_extra_input);
}